

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

void __thiscall SQFuncState::AddParameter(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr local_20;
  
  PushLocalVariable(this,name);
  local_20.super_SQObject._type = name->_type;
  local_20.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
  if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  sqvector<SQObjectPtr>::push_back(&this->_parameters,&local_20);
  SQObjectPtr::~SQObjectPtr(&local_20);
  return;
}

Assistant:

void SQFuncState::AddParameter(const SQObject &name)
{
    PushLocalVariable(name);
    _parameters.push_back(name);
}